

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

string * __thiscall
kratos::Stream::get_var_decl_abi_cxx11_(string *__return_storage_ptr__,Stream *this,Var *var)

{
  size_type *psVar1;
  uint *puVar2;
  char cVar3;
  undefined8 *puVar4;
  InternalException *this_00;
  Var *extraout_RDX;
  Var *extraout_RDX_00;
  Var *extraout_RDX_01;
  Var *var_00;
  Var *var_01;
  Var *var_02;
  string *in_R8;
  shared_ptr<kratos::VarPackedStruct> sVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_type *local_a8;
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  string array_str;
  string var_width;
  
  local_a8 = &type._M_string_length;
  type._M_dataplus._M_p = (pointer)0x0;
  type._M_string_length._0_1_ = 0;
  cVar3 = (**(code **)(*(long *)&this->super_stringstream + 0xb8))(this);
  if (cVar3 == '\0') {
    cVar3 = (**(code **)(*(long *)&this->super_stringstream + 0xd0))(this);
    if (cVar3 == '\0') {
      in_R8 = (string *)0x5;
      std::__cxx11::string::_M_replace((ulong)&local_a8,0,type._M_dataplus._M_p,0x2499a3);
    }
    else {
      puVar4 = (undefined8 *)
               __dynamic_cast(this,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe);
      if (puVar4 == (undefined8 *)0x0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        array_str.field_2._8_8_ = &var_width._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&array_str.field_2 + 8),"Unable to resolve var to enum type","")
        ;
        InternalException::InternalException(this_00,(string *)((long)&array_str.field_2 + 8));
        __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      (**(code **)*puVar4)(puVar4);
      std::__cxx11::string::_M_assign((string *)&local_a8);
    }
  }
  else {
    sVar5 = Var::as<kratos::VarPackedStruct>((Var *)((long)&array_str.field_2 + 8));
    (**(code **)(*(long *)array_str.field_2._8_8_ + 0x168))
              (&str.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,array_str.field_2._8_8_,
               sVar5.super___shared_ptr<kratos::VarPackedStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::__cxx11::string::_M_assign((string *)&local_a8);
    if (array_str._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)array_str._M_dataplus._M_p);
    }
    if (var_width._M_dataplus._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var_width._M_dataplus._M_p);
    }
  }
  psVar1 = &var_width._M_string_length;
  array_str.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&array_str.field_2 + 8),local_a8,
             type._M_dataplus._M_p + (long)local_a8);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&array_str.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&type.field_2 + 8),__l,
           (allocator_type *)
           &str.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  var_00 = extraout_RDX;
  if ((size_type *)array_str.field_2._8_8_ != psVar1) {
    operator_delete((void *)array_str.field_2._8_8_,var_width._M_string_length + 1);
    var_00 = extraout_RDX_00;
  }
  if ((this->super_stringstream).field_0xf0 == '\x01') {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[7]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (type.field_2._M_local_buf + 8),(char (*) [7])0x2430cd);
    var_00 = extraout_RDX_01;
  }
  SystemVerilogCodeGen::get_var_width_str_abi_cxx11_
            ((string *)((long)&array_str.field_2 + 8),(SystemVerilogCodeGen *)this,var_00);
  puVar2 = *(uint **)&(this->super_stringstream).field_0xa0;
  if (((*puVar2 < 2) &&
      ((ulong)(*(long *)&(this->super_stringstream).field_0xa8 - (long)puVar2) < 5)) &&
     (this[1].super_stringstream.field_0x40 != '\x01')) {
    if (var_width._M_dataplus._M_p != (pointer)0x0) {
      cVar3 = (**(code **)(*(long *)&this->super_stringstream + 0xd0))(this);
      if (cVar3 == '\0') {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (type.field_2._M_local_buf + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&array_str.field_2 + 8));
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               (type.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(this->super_stringstream).field_0x78);
  }
  else {
    cVar3 = (**(code **)(*(long *)&this->super_stringstream + 0xc0))(this);
    if (cVar3 == '\0') {
      if (var_width._M_dataplus._M_p != (pointer)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (type.field_2._M_local_buf + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&array_str.field_2 + 8));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (type.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_stringstream).field_0x78);
      get_var_size_str_abi_cxx11_
                ((string *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(kratos *)this,var_02);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (type.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      get_var_size_str_abi_cxx11_
                ((string *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(kratos *)this,var_01);
      if (var_width._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::_M_append
                  ((char *)&str.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   array_str.field_2._8_8_);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (type.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &str.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (type.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_stringstream).field_0x78);
    }
    if (str.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&array_str._M_string_length)
    {
      operator_delete(str.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      array_str._M_string_length + 1);
    }
  }
  str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&array_str._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &str.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage," ","");
  string::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (__return_storage_ptr__,(string *)type.field_2._8_8_,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )str.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )&str.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,in_R8);
  if (str.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&array_str._M_string_length) {
    operator_delete(str.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    array_str._M_string_length + 1);
  }
  if ((size_type *)array_str.field_2._8_8_ != psVar1) {
    operator_delete((void *)array_str.field_2._8_8_,var_width._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&type.field_2 + 8));
  if (local_a8 != &type._M_string_length) {
    operator_delete(local_a8,CONCAT71(type._M_string_length._1_7_,(undefined1)type._M_string_length)
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Stream::get_var_decl(kratos::Var* var) {
    // based on whether it's packed or not
    std::string type;
    if (var->is_struct()) {
        auto v = var->as<VarPackedStruct>();
        type = v->packed_struct()->struct_name;
    } else if (var->is_enum()) {
        auto* v = dynamic_cast<EnumType*>(var);
        if (!v) throw InternalException("Unable to resolve var to enum type");
        type = v->enum_type()->name;
    } else {
        type = "logic";
    }

    std::vector<std::string> str = {type};
    if (var->is_signed()) str.emplace_back("signed");
    std::string var_width = SystemVerilogCodeGen::get_var_width_str(var);
    if (var->size().front() > 1 || var->size().size() > 1 || var->explicit_array()) {
        // it's an array
        if (var->is_packed()) {
            std::string array_str = get_var_size_str(var);
            if (!var_width.empty()) array_str.append(var_width);
            str.emplace_back(array_str);
            str.emplace_back(var->name);
        } else {
            if (!var_width.empty()) str.emplace_back(var_width);
            str.emplace_back(var->name);
            std::string array_str = get_var_size_str(var);
            str.emplace_back(array_str);
        }
    } else {
        // scalar
        if (!var_width.empty() && !var->is_enum()) str.emplace_back(var_width);
        str.emplace_back(var->name);
    }

    auto var_str = string::join(str.begin(), str.end(), " ");
    return var_str;
}